

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O2

void __thiscall QWidgetAction::setDefaultWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  char cVar3;
  QWidget *pQVar4;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x1a8);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = *(QWidget **)(lVar1 + 0x1b0);
  }
  if ((pQVar4 != widget) && ((*(byte *)(lVar1 + 0x1d0) & 1) == 0)) {
    if ((lVar2 != 0) && ((*(int *)(lVar2 + 4) != 0 && (*(long **)(lVar1 + 0x1b0) != (long *)0x0))))
    {
      (**(code **)(**(long **)(lVar1 + 0x1b0) + 0x20))();
    }
    QWeakPointer<QObject>::assign<QObject>
              ((QWeakPointer<QObject> *)(lVar1 + 0x1a8),&widget->super_QObject);
    if (widget != (QWidget *)0x0) {
      QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
      QAction::setVisible(SUB81(this,0));
      QWidget::hide(*(QWidget **)(lVar1 + 0x1b0));
      QWidget::setParent(*(QWidget **)(lVar1 + 0x1b0),(QWidget *)0x0);
      *(byte *)(lVar1 + 0x1d0) = *(byte *)(lVar1 + 0x1d0) & 0xfe;
      cVar3 = QAction::isEnabled();
      if (cVar3 == '\0') {
        QWidget::setEnabled(*(QWidget **)(lVar1 + 0x1b0),false);
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidgetAction::setDefaultWidget(QWidget *widget)
{
    Q_D(QWidgetAction);
    if (widget == d->defaultWidget || d->defaultWidgetInUse)
        return;
    delete d->defaultWidget;
    d->defaultWidget = widget;
    if (!widget)
        return;

    setVisible(!QWidgetPrivate::get(widget)->isExplicitlyHidden());
    d->defaultWidget->hide();
    d->defaultWidget->setParent(nullptr);
    d->defaultWidgetInUse = false;
    if (!isEnabled())
        d->defaultWidget->setEnabled(false);
}